

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O1

int_type __thiscall zstr::istreambuf::underflow(istreambuf *this)

{
  unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
  *this_00;
  char cVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  z_stream_wrapper *pzVar5;
  char *pcVar6;
  Exception *this_01;
  pointer __p;
  int iVar7;
  Bytef *pBVar8;
  bool bVar9;
  __uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
  local_40;
  undefined8 local_38;
  
  if (*(long *)&this->field_0x10 == *(long *)&this->field_0x18) {
    pBVar8 = (Bytef *)(this->out_buff)._M_t.
                      super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                      super__Head_base<0UL,_char_*,_false>._M_head_impl;
    this_00 = &this->zstrm_p;
    iVar7 = 0x3e9;
    do {
      iVar7 = iVar7 + -1;
      if (iVar7 == 0) {
        pcVar6 = (char *)__cxa_allocate_exception(0x20);
        local_38 = std::iostream_category();
        local_40._M_t.
        super__Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
        .super__Head_base<0UL,_zstr::detail::z_stream_wrapper_*,_false>._M_head_impl._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar6,(error_code *)"Failed to fill buffer after 1000 tries");
        __cxa_throw(pcVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      if (this->in_buff_start == this->in_buff_end) {
        pcVar6 = (this->in_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                 .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        this->in_buff_start = pcVar6;
        lVar4 = (**(code **)(*(long *)this->sbuf_p + 0x40))(this->sbuf_p,pcVar6,this->buff_size);
        this->in_buff_end = this->in_buff_start + lVar4;
        if (lVar4 == 0) break;
      }
      if ((this->auto_detect == true) && (this->auto_detect_run == false)) {
        this->auto_detect_run = true;
        pcVar6 = this->in_buff_start;
        bVar9 = true;
        if (pcVar6 + 2 <= this->in_buff_end) {
          cVar1 = pcVar6[1];
          if (cVar1 == -0x75 && *pcVar6 == '\x1f') {
            bVar9 = false;
          }
          else if (*pcVar6 == 'x') {
            bVar9 = false;
            if ((cVar1 != '\x01') && (cVar1 != -100)) {
              bVar9 = cVar1 != -0x26;
            }
          }
        }
        this->is_text = bVar9;
      }
      if (this->is_text == true) {
        pcVar6 = (this->out_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                 _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        pcVar2 = (this->in_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                 .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        pBVar8 = (Bytef *)this->in_buff_end;
        (this->in_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl = pcVar6;
        (this->out_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl = pcVar2;
        this->in_buff_start = pcVar6;
        this->in_buff_end = pcVar6;
      }
      else {
        if ((this_00->_M_t).
            super___uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
            ._M_t.
            super__Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
            .super__Head_base<0UL,_zstr::detail::z_stream_wrapper_*,_false>._M_head_impl ==
            (z_stream_wrapper *)0x0) {
          pzVar5 = (z_stream_wrapper *)operator_new(0x78);
          detail::z_stream_wrapper::z_stream_wrapper(pzVar5,true,-1,this->window_bits);
          local_40._M_t.
          super__Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          .super__Head_base<0UL,_zstr::detail::z_stream_wrapper_*,_false>._M_head_impl =
               (tuple<zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                )(_Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                  )0x0;
          std::
          __uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          ::reset((__uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                   *)this_00,pzVar5);
          std::
          unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          ::~unique_ptr((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                         *)&local_40);
        }
        pcVar6 = this->in_buff_start;
        (((this->zstrm_p)._M_t.
          super___uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          ._M_t.
          super__Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          .super__Head_base<0UL,_zstr::detail::z_stream_wrapper_*,_false>._M_head_impl)->
        super_z_stream).next_in = (Bytef *)pcVar6;
        pzVar5 = (this->zstrm_p)._M_t.
                 super___uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 .super__Head_base<0UL,_zstr::detail::z_stream_wrapper_*,_false>._M_head_impl;
        (pzVar5->super_z_stream).avail_in = *(int *)&this->in_buff_end - (int)pcVar6;
        (pzVar5->super_z_stream).next_out = pBVar8;
        (((this->zstrm_p)._M_t.
          super___uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          ._M_t.
          super__Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          .super__Head_base<0UL,_zstr::detail::z_stream_wrapper_*,_false>._M_head_impl)->
        super_z_stream).avail_out =
             (*(int *)&(this->out_buff)._M_t.
                       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl + (int)this->buff_size) -
             (int)pBVar8;
        uVar3 = inflate();
        if (1 < uVar3) {
          this_01 = (Exception *)__cxa_allocate_exception(0x20);
          Exception::Exception
                    (this_01,&((this_00->_M_t).
                               super___uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                               .super__Head_base<0UL,_zstr::detail::z_stream_wrapper_*,_false>.
                              _M_head_impl)->super_z_stream,uVar3);
          __cxa_throw(this_01,&Exception::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
        }
        pzVar5 = (this->zstrm_p)._M_t.
                 super___uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 .super__Head_base<0UL,_zstr::detail::z_stream_wrapper_*,_false>._M_head_impl;
        pcVar6 = (char *)(pzVar5->super_z_stream).next_in;
        this->in_buff_start = pcVar6;
        this->in_buff_end = pcVar6 + (pzVar5->super_z_stream).avail_in;
        pBVar8 = (pzVar5->super_z_stream).next_out;
        if (uVar3 == 1) {
          std::
          __uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          ::reset((__uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                   *)this_00,(pointer)0x0);
        }
      }
    } while (pBVar8 == (Bytef *)(this->out_buff)._M_t.
                                super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                super__Head_base<0UL,_char_*,_false>._M_head_impl);
    pcVar6 = (this->out_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    *(char **)&this->field_0x8 = pcVar6;
    *(char **)&this->field_0x10 = pcVar6;
    *(Bytef **)&this->field_0x18 = pBVar8;
  }
  if (*(byte **)&this->field_0x10 == *(byte **)&this->field_0x18) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = (uint)**(byte **)&this->field_0x10;
  }
  return uVar3;
}

Assistant:

std::streambuf::int_type underflow() override {
    if (this->gptr() == this->egptr()) {
      // pointers for free region in output buffer
      char* out_buff_free_start = out_buff.get();
      int tries = 0;
      do {
        if (++tries > 1000) {
          throw std::ios_base::failure(
              "Failed to fill buffer after 1000 tries");
        }

        // read more input if none available
        if (in_buff_start == in_buff_end) {
          // empty input buffer: refill from the start
          in_buff_start = in_buff.get();
          std::streamsize sz = sbuf_p->sgetn(
              in_buff.get(), static_cast<std::streamsize>(buff_size));
          in_buff_end = in_buff_start + sz;
          if (in_buff_end == in_buff_start) break;  // end of input
        }
        // auto detect if the stream contains text or deflate data
        if (auto_detect && !auto_detect_run) {
          auto_detect_run = true;
          unsigned char b0 = *reinterpret_cast<unsigned char*>(in_buff_start);
          unsigned char b1 =
              *reinterpret_cast<unsigned char*>(in_buff_start + 1);
          // Ref:
          // http://en.wikipedia.org/wiki/Gzip
          // http://stackoverflow.com/questions/9050260/what-does-a-zlib-header-look-like
          is_text = !(in_buff_start + 2 <= in_buff_end &&
                      ((b0 == 0x1F && b1 == 0x8B)     // gzip header
                       || (b0 == 0x78 && (b1 == 0x01  // zlib header
                                          || b1 == 0x9C || b1 == 0xDA))));
        }
        if (is_text) {
          // simply swap in_buff and out_buff, and adjust pointers
          assert(in_buff_start == in_buff.get());
          std::swap(in_buff, out_buff);
          out_buff_free_start = in_buff_end;
          in_buff_start = in_buff.get();
          in_buff_end = in_buff.get();
        } else {
          // run inflate() on input
          if (!zstrm_p)
            zstrm_p = std::unique_ptr<detail::z_stream_wrapper>(
                new detail::z_stream_wrapper(true, Z_DEFAULT_COMPRESSION,
                                             window_bits));
          zstrm_p->next_in =
              reinterpret_cast<decltype(zstrm_p->next_in)>(in_buff_start);
          zstrm_p->avail_in = uint32_t(in_buff_end - in_buff_start);
          zstrm_p->next_out = reinterpret_cast<decltype(zstrm_p->next_out)>(
              out_buff_free_start);
          zstrm_p->avail_out =
              uint32_t((out_buff.get() + buff_size) - out_buff_free_start);
          int ret = inflate(zstrm_p.get(), Z_NO_FLUSH);
          // process return code
          if (ret != Z_OK && ret != Z_STREAM_END)
            throw Exception(zstrm_p.get(), ret);
          // update in&out pointers following inflate()
          in_buff_start =
              reinterpret_cast<decltype(in_buff_start)>(zstrm_p->next_in);
          in_buff_end = in_buff_start + zstrm_p->avail_in;
          out_buff_free_start = reinterpret_cast<decltype(out_buff_free_start)>(
              zstrm_p->next_out);
          assert(out_buff_free_start + zstrm_p->avail_out ==
                 out_buff.get() + buff_size);

          if (ret == Z_STREAM_END) {
            // if stream ended, deallocate inflator
            zstrm_p.reset();
          }
        }
      } while (out_buff_free_start == out_buff.get());
      // 2 exit conditions:
      // - end of input: there might or might not be output available
      // - out_buff_free_start != out_buff: output available
      this->setg(out_buff.get(), out_buff.get(), out_buff_free_start);
    }
    return this->gptr() == this->egptr()
               ? traits_type::eof()
               : traits_type::to_int_type(*this->gptr());
  }